

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::OneD::MultiUPCEANReader::decodePattern
          (Barcode *__return_storage_ptr__,MultiUPCEANReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  ushort *puVar3;
  double dVar4;
  PatternView begin;
  PatternView begin_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined2 uVar9;
  undefined1 uVar10;
  BarcodeFormat format;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined2 uVar15;
  undefined1 uVar16;
  bool bVar17;
  char cVar18;
  char cVar19;
  ushort uVar20;
  int *piVar21;
  Iterator puVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  ushort *puVar26;
  long lVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *upce;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  ulong uVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  Iterator *ppuVar29;
  ushort *puVar30;
  Iterator puVar31;
  ushort uVar32;
  int *piVar33;
  byte bVar34;
  byte bVar35;
  uint uVar36;
  int iVar37;
  anon_class_16_2_7a905435 isGuard;
  Error error;
  PartialResult addOnRes;
  PartialResult res;
  uint local_1d0;
  PatternView local_1b8;
  undefined7 local_198;
  undefined1 uStack_191;
  undefined2 uStack_190;
  undefined1 uStack_18e;
  PartialResult local_188;
  PartialResult local_140;
  long local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  int local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ushort *local_c0;
  int iStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ushort *puStack_a8;
  ushort *local_a0;
  int iStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ushort *puStack_88;
  Error local_80;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined1 uStack_38;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  isGuard.minQuietZone = 6.0;
  isGuard.pattern = (FixedPattern<3,_3,_false> *)param_3;
  FindLeftGuard<3,ZXing::FindLeftGuard<3,3,false>(ZXing::PatternView_const&,int,ZXing::FixedPattern<3,3,false>const&,double)::_lambda(ZXing::PatternView_const&,int)_1_>
            ((PatternView *)&local_140,(ZXing *)next,(PatternView *)0x21,0x1992a0,isGuard);
  next->_base = (Iterator)local_140.txt.field_2._M_allocated_capacity;
  next->_end = (Iterator)local_140.txt.field_2._8_8_;
  next->_data = (Iterator)local_140.txt._M_dataplus._M_p;
  *(size_type *)&next->_size = local_140.txt._M_string_length;
  puVar22 = next->_data;
  if (((puVar22 == (Iterator)0x0) || (puVar22 < next->_base)) ||
     (next->_end < puVar22 + next->_size)) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_e4 = rowNumber;
  PartialResult::PartialResult(&local_140);
  uVar16 = local_188.txt.field_2._M_local_buf[0xf];
  uVar15 = local_188.txt.field_2._13_2_;
  uVar14 = local_188.txt.field_2._M_local_buf[0xc];
  uVar13 = local_188.txt.field_2._8_4_;
  uVar12 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar11 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  puVar22 = next->_data;
  puVar31 = next->_base;
  local_f8 = (long)next->_size;
  puVar3 = next->_end;
  uVar36 = (((this->super_RowReader)._opts)->_formats).i;
  local_188.txt.field_2._M_allocated_capacity._0_4_ = SUB84(puVar31,0);
  uVar5 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  local_188.txt.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)puVar31 >> 0x20);
  uVar6 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  local_188.txt.field_2._M_local_buf[0xc] = (char)((ulong)puVar3 >> 0x20);
  uVar8 = local_188.txt.field_2._M_local_buf[0xc];
  local_188.txt.field_2._M_local_buf[0xf] = (char)((ulong)puVar3 >> 0x38);
  uVar10 = local_188.txt.field_2._M_local_buf[0xf];
  local_188.txt.field_2._13_2_ = (undefined2)((ulong)puVar3 >> 0x28);
  uVar9 = local_188.txt.field_2._13_2_;
  local_188.txt.field_2._8_4_ = SUB84(puVar3,0);
  uVar7 = local_188.txt.field_2._8_4_;
  if (uVar36 != 0 && (uVar36 & 0x4200) == 0) {
LAB_00164a31:
    local_188.txt.field_2._M_local_buf[0xf] = uVar16;
    local_188.txt.field_2._13_2_ = uVar15;
    local_188.txt.field_2._M_local_buf[0xc] = uVar14;
    local_188.txt.field_2._8_4_ = uVar13;
    local_188.txt.field_2._M_allocated_capacity._4_4_ = uVar12;
    local_188.txt.field_2._M_allocated_capacity._0_4_ = uVar11;
    uVar36 = (((this->super_RowReader)._opts)->_formats).i;
    if (uVar36 == 0 || (uVar36 >> 8 & 1) != 0) {
      local_188.txt._M_dataplus._M_p = (pointer)(puVar22 + 0x28);
      local_188.txt._M_string_length = CONCAT44(local_188.txt._M_string_length._4_4_,3);
      puVar26 = puVar22 + 0x2b;
      local_188.txt.field_2._M_allocated_capacity._0_4_ = uVar5;
      local_188.txt.field_2._M_allocated_capacity._4_4_ = uVar6;
      local_188.txt.field_2._8_4_ = uVar7;
      local_188.txt.field_2._M_local_buf[0xc] = uVar8;
      local_188.txt.field_2._13_2_ = uVar9;
      local_188.txt.field_2._M_local_buf[0xf] = uVar10;
      if (puVar26 <= puVar3 && puVar31 <= local_188.txt._M_dataplus._M_p) {
        if (puVar26 == puVar3 + -1) {
          uVar36 = 0x7fffffff;
        }
        else {
          uVar36 = (uint)*puVar26;
        }
        dVar4 = IsPattern<false,3,3>
                          ((PatternView *)&local_188,(FixedPattern<3,_3,_false> *)&END_PATTERN,
                           uVar36,3.0,0.0);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          lVar25 = -10;
          uVar20 = 0;
          do {
            uVar20 = uVar20 + *(short *)((long)puVar22 + lVar25 + 0x30);
            lVar25 = lVar25 + 2;
          } while (lVar25 != 0);
          dVar4 = (double)uVar20 / 5.0;
          lVar25 = 0;
          do {
            if (dVar4 * 0.5 + 0.5 <
                ABS((double)*(ushort *)((long)puVar22 + lVar25 + 0x26) -
                    (double)*(ushort *)((long)&MID_PATTERN + lVar25) * dVar4)) {
              dVar4 = 0.0;
              break;
            }
            lVar25 = lVar25 + 2;
          } while (lVar25 != 10);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            if ((int)local_f8 == 0) {
              uVar36 = 0;
            }
            else {
              lVar25 = 0;
              uVar36 = 0;
              do {
                uVar36 = (uint)(ushort)((short)uVar36 + *(short *)((long)puVar22 + lVar25));
                lVar25 = lVar25 + 2;
              } while (local_f8 * 2 != lVar25);
            }
            lVar25 = -10;
            uVar20 = 0;
            do {
              uVar20 = uVar20 + *(short *)((long)puVar22 + lVar25 + 0x30);
              lVar25 = lVar25 + 2;
            } while (lVar25 != 0);
            if ((long)(int)local_188.txt._M_string_length == 0) {
              uVar23 = 0;
            }
            else {
              lVar25 = 0;
              uVar32 = 0;
              do {
                uVar32 = uVar32 + *(short *)(local_188.txt._M_dataplus._M_p + lVar25);
                lVar25 = lVar25 + 2;
              } while ((long)(int)local_188.txt._M_string_length * 2 != lVar25);
              uVar23 = (uint)uVar32;
            }
            local_1b8._data = (Iterator)0x1800000003;
            lVar25 = 0;
            do {
              lVar27 = 0;
              do {
                uVar2 = *(undefined8 *)
                         (puVar22 + (long)*(int *)((long)&local_1b8._data + lVar25) + lVar27 * 4);
                if (0.2 <= ABS(((float)(ushort)((short)((ulong)uVar2 >> 0x30) +
                                                (short)((ulong)uVar2 >> 0x10) +
                                               (short)((ulong)uVar2 >> 0x20) + (short)uVar2) / 7.0)
                               / ((float)(uVar36 + uVar20 + uVar23) / 11.0) + -1.0))
                goto LAB_00164e0c;
                lVar27 = lVar27 + 1;
              } while (lVar27 != 4);
              lVar25 = lVar25 + 4;
            } while (lVar25 != 8);
            ppuVar29 = (Iterator *)(puVar22 + 3);
            local_1b8._size = 4;
            local_140.txt._M_string_length = 0;
            *local_140.txt._M_dataplus._M_p = '\0';
            local_1b8._data = (Iterator)ppuVar29;
            local_1b8._base = puVar31;
            local_1b8._end = puVar3;
            bVar17 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
            if (bVar17) {
              uVar36 = 0xffffffff;
              do {
                if (ppuVar29 != (Iterator *)0x0) {
                  ppuVar29 = ppuVar29 + 1;
                  local_1b8._data = (Iterator)ppuVar29;
                }
                if (uVar36 == 2) {
                  uVar36 = 3;
                  break;
                }
                bVar17 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
                uVar36 = uVar36 + 1;
              } while (bVar17);
              if (2 < uVar36) {
                ppuVar29 = (Iterator *)((long)local_1b8._data + 10);
                local_1b8._size = 4;
                local_1b8._data = (Iterator)ppuVar29;
                local_1b8._base = puVar31;
                local_1b8._end = puVar3;
                bVar17 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
                if (bVar17) {
                  uVar36 = 0xffffffff;
                  upce = extraout_RDX_00;
                  do {
                    if (ppuVar29 != (Iterator *)0x0) {
                      ppuVar29 = ppuVar29 + 1;
                      local_1b8._data = (Iterator)ppuVar29;
                    }
                    if (uVar36 == 2) {
                      uVar36 = 3;
                      break;
                    }
                    bVar17 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
                    uVar36 = uVar36 + 1;
                    upce = extraout_RDX_01;
                  } while (bVar17);
                  if (2 < uVar36) {
                    local_140.end._end._4_4_ =
                         CONCAT13(local_188.txt.field_2._M_local_buf[0xf],
                                  CONCAT21(local_188.txt.field_2._13_2_,
                                           local_188.txt.field_2._M_local_buf[0xc]));
                    local_140.end._base._0_4_ = local_188.txt.field_2._M_allocated_capacity._0_4_;
                    local_140.end._base._4_4_ = local_188.txt.field_2._M_allocated_capacity._4_4_;
                    local_140.end._end._0_4_ = local_188.txt.field_2._8_4_;
                    local_140.end._data._0_4_ = local_188.txt._M_dataplus._M_p._0_4_;
                    local_140.end._data._4_4_ = local_188.txt._M_dataplus._M_p._4_4_;
                    local_140.end._size = (int)local_188.txt._M_string_length;
                    local_140.end._12_4_ = local_188.txt._M_string_length._4_4_;
                    local_140.format = EAN8;
                    goto LAB_00165162;
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00164e0c:
    iVar37 = (((this->super_RowReader)._opts)->_formats).i;
    if (iVar37 == 0 || (short)iVar37 < 0) {
      local_188.txt._M_dataplus._M_p = (pointer)(puVar22 + 0x1b);
      local_188.txt._M_string_length = CONCAT44(local_188.txt._M_string_length._4_4_,6);
      puVar26 = puVar22 + 0x21;
      local_188.txt.field_2._M_allocated_capacity._0_4_ = uVar5;
      local_188.txt.field_2._M_allocated_capacity._4_4_ = uVar6;
      local_188.txt.field_2._8_4_ = uVar7;
      local_188.txt.field_2._M_local_buf[0xc] = uVar8;
      local_188.txt.field_2._13_2_ = uVar9;
      local_188.txt.field_2._M_local_buf[0xf] = uVar10;
      if (puVar26 <= puVar3 && puVar31 <= local_188.txt._M_dataplus._M_p) {
        if (puVar26 == puVar3 + -1) {
          uVar36 = 0x7fffffff;
        }
        else {
          uVar36 = (uint)*puVar26;
        }
        dVar4 = IsPattern<false,6,6>
                          ((PatternView *)&local_188,(FixedPattern<6,_6,_false> *)UPCE_END_PATTERN,
                           uVar36,6.0,0.0);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          uVar23 = 0;
          uVar36 = 0;
          if ((int)local_f8 != 0) {
            lVar25 = 0;
            uVar20 = 0;
            do {
              uVar20 = uVar20 + *(short *)((long)puVar22 + lVar25);
              lVar25 = lVar25 + 2;
            } while (local_f8 * 2 != lVar25);
            uVar36 = (uint)uVar20;
          }
          if ((long)(int)local_188.txt._M_string_length != 0) {
            lVar25 = 0;
            uVar20 = 0;
            do {
              uVar20 = uVar20 + *(short *)(local_188.txt._M_dataplus._M_p + lVar25);
              lVar25 = lVar25 + 2;
            } while ((long)(int)local_188.txt._M_string_length * 2 != lVar25);
            uVar23 = (uint)uVar20;
          }
          lVar25 = 0;
          do {
            uVar2 = *(undefined8 *)(puVar22 + lVar25 * 4 + 3);
            if (0.2 <= ABS(((float)(ushort)((short)((ulong)uVar2 >> 0x30) +
                                            (short)((ulong)uVar2 >> 0x10) +
                                           (short)((ulong)uVar2 >> 0x20) + (short)uVar2) / 7.0) /
                           ((float)(uVar23 + uVar36) / 9.0) + -1.0)) goto LAB_001650aa;
            lVar25 = lVar25 + 1;
          } while (lVar25 != 6);
          ppuVar29 = (Iterator *)(puVar22 + 3);
          local_1b8._size = 4;
          local_e0._M_dataplus._M_p._0_4_ = 0;
          local_1b8._data = (Iterator)ppuVar29;
          local_1b8._base = puVar31;
          local_1b8._end = puVar3;
          std::__cxx11::string::_M_replace
                    ((ulong)&local_140,0,(char *)local_140.txt._M_string_length,0x194b13);
          bVar17 = DecodeDigit(&local_1b8,&local_140.txt,(int *)&local_e0);
          if (bVar17) {
            uVar36 = 0xffffffff;
            do {
              if (ppuVar29 != (Iterator *)0x0) {
                ppuVar29 = ppuVar29 + 1;
                local_1b8._data = (Iterator)ppuVar29;
              }
              if (uVar36 == 4) {
                uVar36 = 5;
                break;
              }
              bVar17 = DecodeDigit(&local_1b8,&local_140.txt,(int *)&local_e0);
              uVar36 = uVar36 + 1;
            } while (bVar17);
            if (4 < uVar36) {
              piVar21 = &DAT_00197b04;
              uVar28 = 6;
              do {
                if (piVar21[-2] == (int)local_e0._M_dataplus._M_p) {
                  piVar33 = piVar21 + -2;
                  break;
                }
                if (piVar21[-1] == (int)local_e0._M_dataplus._M_p) {
                  piVar33 = piVar21 + -1;
                  break;
                }
                piVar33 = piVar21;
                if (*piVar21 == (int)local_e0._M_dataplus._M_p) break;
                if (piVar21[1] == (int)local_e0._M_dataplus._M_p) {
                  piVar33 = piVar21 + 1;
                  break;
                }
                uVar28 = uVar28 - 1;
                piVar21 = piVar21 + 4;
                piVar33 = (int *)Code128::CODE_PATTERNS;
              } while (1 < uVar28);
              iVar37 = (int)((ulong)(piVar33 + -0x65ebf) >> 2);
              if (iVar37 != -1 && piVar33 != (int *)Code128::CODE_PATTERNS) {
                cVar18 = ToDigit<char>(iVar37 / 10);
                *local_140.txt._M_dataplus._M_p = cVar18;
                ToDigit<char>(iVar37 % 10);
                std::__cxx11::string::push_back((char)&local_140);
                local_140.end._end._4_4_ =
                     CONCAT13(local_188.txt.field_2._M_local_buf[0xf],
                              CONCAT21(local_188.txt.field_2._13_2_,
                                       local_188.txt.field_2._M_local_buf[0xc]));
                local_140.end._base._0_4_ = local_188.txt.field_2._M_allocated_capacity._0_4_;
                local_140.end._base._4_4_ = local_188.txt.field_2._M_allocated_capacity._4_4_;
                local_140.end._end._0_4_ = local_188.txt.field_2._8_4_;
                local_140.end._data._0_4_ = local_188.txt._M_dataplus._M_p._0_4_;
                local_140.end._data._4_4_ = local_188.txt._M_dataplus._M_p._4_4_;
                local_140.end._size = (int)local_188.txt._M_string_length;
                local_140.end._12_4_ = local_188.txt._M_string_length._4_4_;
                local_140.format = UPCE;
                upce = extraout_RDX_02;
                goto LAB_00165162;
              }
            }
          }
        }
      }
    }
LAB_001650aa:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    goto LAB_001650c1;
  }
  local_188.txt._M_dataplus._M_p = (pointer)(puVar22 + 0x38);
  local_188.txt._M_string_length = CONCAT44(local_188.txt._M_string_length._4_4_,3);
  puVar26 = puVar22 + 0x3b;
  uVar11 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar12 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar13 = local_188.txt.field_2._8_4_;
  uVar14 = local_188.txt.field_2._M_local_buf[0xc];
  uVar15 = local_188.txt.field_2._13_2_;
  uVar16 = local_188.txt.field_2._M_local_buf[0xf];
  if (puVar3 < puVar26 || local_188.txt._M_dataplus._M_p < puVar31) goto LAB_00164a31;
  if (puVar26 == puVar3 + -1) {
    uVar36 = 0x7fffffff;
  }
  else {
    uVar36 = (uint)*puVar26;
  }
  dVar4 = IsPattern<false,3,3>
                    ((PatternView *)&local_188,(FixedPattern<3,_3,_false> *)&END_PATTERN,uVar36,3.0,
                     0.0);
  uVar11 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar12 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar13 = local_188.txt.field_2._8_4_;
  uVar14 = local_188.txt.field_2._M_local_buf[0xc];
  uVar15 = local_188.txt.field_2._13_2_;
  uVar16 = local_188.txt.field_2._M_local_buf[0xf];
  if ((dVar4 == 0.0) && (!NAN(dVar4))) goto LAB_00164a31;
  lVar25 = -10;
  uVar20 = 0;
  do {
    uVar20 = uVar20 + *(short *)((long)puVar22 + lVar25 + 0x40);
    lVar25 = lVar25 + 2;
  } while (lVar25 != 0);
  dVar4 = (double)uVar20 / 5.0;
  lVar25 = 0;
  do {
    if (dVar4 * 0.5 + 0.5 <
        ABS((double)*(ushort *)((long)puVar22 + lVar25 + 0x36) -
            (double)*(ushort *)((long)&MID_PATTERN + lVar25) * dVar4)) {
      dVar4 = 0.0;
      break;
    }
    lVar25 = lVar25 + 2;
  } while (lVar25 != 10);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) goto LAB_00164a31;
  ppuVar29 = (Iterator *)(puVar22 + 3);
  local_1b8._size = 4;
  local_1b8._data = (Iterator)ppuVar29;
  local_1b8._base = puVar31;
  local_1b8._end = puVar3;
  std::__cxx11::string::_M_replace
            ((ulong)&local_140,0,(char *)local_140.txt._M_string_length,0x194b13);
  local_e0._M_dataplus._M_p._0_4_ = 0;
  bVar17 = DecodeDigit(&local_1b8,&local_140.txt,(int *)&local_e0);
  uVar11 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar12 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar13 = local_188.txt.field_2._8_4_;
  uVar14 = local_188.txt.field_2._M_local_buf[0xc];
  uVar15 = local_188.txt.field_2._13_2_;
  uVar16 = local_188.txt.field_2._M_local_buf[0xf];
  if (!bVar17) goto LAB_00164a31;
  uVar36 = 0xffffffff;
  do {
    if (ppuVar29 != (Iterator *)0x0) {
      ppuVar29 = ppuVar29 + 1;
      local_1b8._data = (Iterator)ppuVar29;
    }
    if (uVar36 == 4) {
      uVar36 = 5;
      break;
    }
    bVar17 = DecodeDigit(&local_1b8,&local_140.txt,(int *)&local_e0);
    uVar36 = uVar36 + 1;
  } while (bVar17);
  uVar11 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar12 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar13 = local_188.txt.field_2._8_4_;
  uVar14 = local_188.txt.field_2._M_local_buf[0xc];
  uVar15 = local_188.txt.field_2._13_2_;
  uVar16 = local_188.txt.field_2._M_local_buf[0xf];
  if (uVar36 < 5) goto LAB_00164a31;
  ppuVar29 = (Iterator *)((long)local_1b8._data + 10);
  local_1b8._size = 4;
  local_1b8._data = (Iterator)ppuVar29;
  local_1b8._base = puVar31;
  local_1b8._end = puVar3;
  bVar17 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
  uVar11 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar12 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar13 = local_188.txt.field_2._8_4_;
  uVar14 = local_188.txt.field_2._M_local_buf[0xc];
  uVar15 = local_188.txt.field_2._13_2_;
  uVar16 = local_188.txt.field_2._M_local_buf[0xf];
  if (!bVar17) goto LAB_00164a31;
  uVar36 = 0xffffffff;
  do {
    if (ppuVar29 != (Iterator *)0x0) {
      ppuVar29 = ppuVar29 + 1;
      local_1b8._data = (Iterator)ppuVar29;
    }
    if (uVar36 == 4) {
      uVar36 = 5;
      break;
    }
    bVar17 = DecodeDigit(&local_1b8,&local_140.txt,(int *)0x0);
    uVar36 = uVar36 + 1;
  } while (bVar17);
  uVar11 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar12 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar13 = local_188.txt.field_2._8_4_;
  uVar14 = local_188.txt.field_2._M_local_buf[0xc];
  uVar15 = local_188.txt.field_2._13_2_;
  uVar16 = local_188.txt.field_2._M_local_buf[0xf];
  if (uVar36 < 5) goto LAB_00164a31;
  piVar21 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (FIRST_DIGIT_ENCODINGS,UPCE_END_PATTERN,&local_e0);
  iVar37 = (int)((ulong)(piVar21 + -0x664b8) >> 2);
  uVar11 = local_188.txt.field_2._M_allocated_capacity._0_4_;
  uVar12 = local_188.txt.field_2._M_allocated_capacity._4_4_;
  uVar13 = local_188.txt.field_2._8_4_;
  uVar14 = local_188.txt.field_2._M_local_buf[0xc];
  uVar15 = local_188.txt.field_2._13_2_;
  uVar16 = local_188.txt.field_2._M_local_buf[0xf];
  if (iVar37 == -1 || piVar21 == (int *)UPCE_END_PATTERN) goto LAB_00164a31;
  cVar18 = ToDigit<char>(iVar37);
  *local_140.txt._M_dataplus._M_p = cVar18;
  local_140.end._end._4_4_ =
       CONCAT13(local_188.txt.field_2._M_local_buf[0xf],
                CONCAT21(local_188.txt.field_2._13_2_,local_188.txt.field_2._M_local_buf[0xc]));
  local_140.end._base._0_4_ = local_188.txt.field_2._M_allocated_capacity._0_4_;
  local_140.end._base._4_4_ = local_188.txt.field_2._M_allocated_capacity._4_4_;
  local_140.end._end._0_4_ = local_188.txt.field_2._8_4_;
  local_140.end._data._0_4_ = local_188.txt._M_dataplus._M_p._0_4_;
  local_140.end._data._4_4_ = local_188.txt._M_dataplus._M_p._4_4_;
  local_140.end._size = (int)local_188.txt._M_string_length;
  local_140.end._12_4_ = local_188.txt._M_string_length._4_4_;
  local_140.format = EAN13;
  upce = extraout_RDX;
LAB_00165162:
  local_1b8._data = (Iterator)&local_1b8._base;
  local_1b8._8_8_ = 0;
  local_1b8._base = (Iterator)((ulong)local_1b8._base & 0xffffffffffffff00);
  local_198 = 0;
  uStack_191 = 0;
  uStack_190 = 0xffff;
  uStack_18e = 0;
  local_188.txt.field_2._M_allocated_capacity._0_4_ = (int)local_140.end._base;
  local_188.txt.field_2._M_allocated_capacity._4_4_ = local_140.end._base._4_4_;
  local_188.txt.field_2._8_4_ = local_140.end._end._0_4_;
  if (local_140.format == UPCE) {
    UPCEANCommon::ConvertUPCEtoUPCA<std::__cxx11::string>
              (&local_188.txt,(UPCEANCommon *)&local_140,upce);
  }
  else {
    local_188.txt._M_dataplus._M_p = (pointer)&local_188.txt.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_140.txt._M_dataplus._M_p,
               (char *)(local_140.txt._M_string_length + (long)local_140.txt._M_dataplus._M_p));
  }
  cVar19 = GTIN::ComputeCheckDigit<char>(&local_188.txt,true);
  cVar18 = local_188.txt._M_dataplus._M_p[local_188.txt._M_string_length - 1];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.txt._M_dataplus._M_p != &local_188.txt.field_2) {
    operator_delete(local_188.txt._M_dataplus._M_p,
                    CONCAT44(local_188.txt.field_2._M_allocated_capacity._4_4_,
                             local_188.txt.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (cVar19 != cVar18) {
    local_48 = 0;
    local_188.txt._M_dataplus._M_p = (pointer)&local_188.txt.field_2;
    local_188.txt.field_2._M_allocated_capacity._1_3_ = (undefined3)uStack_3f;
    local_188.txt.field_2._M_allocated_capacity._0_4_ =
         (uint)(uint3)local_188.txt.field_2._M_allocated_capacity._1_3_ << 8;
    local_188.txt.field_2._M_allocated_capacity._4_4_ = (undefined4)((uint7)uStack_3f >> 0x18);
    local_188.txt.field_2._9_3_ = (undefined3)local_37;
    local_188.txt.field_2._M_local_buf[8] = uStack_38;
    local_188.txt.field_2._M_local_buf[0xc] = (char)((uint)local_37 >> 0x18);
    local_188.txt.field_2._13_2_ = local_33;
    local_188.txt.field_2._M_local_buf[0xf] = local_31;
    local_188.txt._M_string_length = 0;
    local_40 = 0;
    local_188.end._data._0_4_ = 0x199348;
    local_188.end._data._4_4_ = 0;
    local_188.end._size._0_2_ = 0x11b;
    local_188.end._size._2_1_ = 2;
    local_50 = &local_40;
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_188);
    uStack_190 = (undefined2)local_188.end._size;
    uStack_18e = local_188.end._size._2_1_;
    local_198 = (undefined7)CONCAT44(local_188.end._data._4_4_,local_188.end._data._0_4_);
    uStack_191 = (undefined1)((uint)local_188.end._data._4_4_ >> 0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.txt._M_dataplus._M_p != &local_188.txt.field_2) {
      operator_delete(local_188.txt._M_dataplus._M_p,
                      CONCAT44(local_188.txt.field_2._M_allocated_capacity._4_4_,
                               local_188.txt.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  uVar36 = (((this->super_RowReader)._opts)->_formats).i;
  if (((uVar36 == 0 || (uVar36 >> 0xe & 1) != 0) && (local_140.format == EAN13)) &&
     (*local_140.txt._M_dataplus._M_p == '0')) {
    std::__cxx11::string::substr((ulong)&local_188,(ulong)&local_140);
    std::__cxx11::string::operator=((string *)&local_140,(string *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.txt._M_dataplus._M_p != &local_188.txt.field_2) {
      operator_delete(local_188.txt._M_dataplus._M_p,
                      CONCAT44(local_188.txt.field_2._M_allocated_capacity._4_4_,
                               local_188.txt.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_140.format = UPCA;
  }
  iVar37 = local_140.end._size;
  if ((local_140.format == EAN13) &&
     (uVar36 = (((this->super_RowReader)._opts)->_formats).i, uVar36 != 0 && (uVar36 >> 9 & 1) == 0)
     ) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
  }
  else {
    bVar17 = local_140.format == EAN8;
    next->_base = (Iterator)CONCAT44(local_140.end._base._4_4_,(int)local_140.end._base);
    next->_end = (Iterator)CONCAT44(local_140.end._end._4_4_,local_140.end._end._0_4_);
    next->_data = (Iterator)CONCAT44(local_140.end._data._4_4_,local_140.end._data._0_4_);
    *(ulong *)&next->_size = CONCAT44(local_140.end._12_4_,local_140.end._size);
    lVar25 = CONCAT44(local_140.end._data._4_4_,local_140.end._data._0_4_);
    local_f0 = CONCAT44((int)local_140.end._base,local_140.end._12_4_);
    local_e8 = local_140.end._base._4_4_;
    puVar3 = (ushort *)CONCAT44(local_140.end._end._4_4_,local_140.end._end._0_4_);
    PartialResult::PartialResult(&local_188);
    bVar34 = bVar17 << 2 | 0x30;
    bVar35 = bVar34;
    if ((((this->super_RowReader)._opts)->field_0x1 & 0x60) != 0) {
      lVar27 = (long)iVar37;
      puVar26 = (ushort *)(lVar27 * 2 + lVar25);
      if ((lVar25 != 0) && (puVar26 + lVar27 <= puVar3)) {
        if ((int)local_f8 == 0) {
          iVar24 = 0;
        }
        else {
          lVar25 = 0;
          uVar20 = 0;
          do {
            uVar20 = uVar20 + *(short *)((long)puVar22 + lVar25);
            lVar25 = lVar25 + 2;
          } while (local_f8 * 2 != lVar25);
          iVar24 = (int)((double)uVar20 * 3.5);
        }
        if (puVar26 == (ushort *)0x0) {
          bVar17 = false;
          puVar30 = (ushort *)0x0;
        }
        else {
          puVar30 = puVar26 + 1;
          if (puVar3 < puVar26 + lVar27 + 1) {
            bVar17 = false;
          }
          else {
            bVar17 = (int)(uint)*puVar26 <= iVar24;
          }
        }
        if (bVar17) {
          iStack_98 = iVar37;
          uStack_94 = (undefined4)local_f0;
          uStack_90 = (undefined4)((ulong)local_f0 >> 0x20);
          uStack_8c = local_e8;
          begin._12_4_ = uStack_94;
          begin._size = iVar37;
          begin._data = puVar30;
          begin._base._0_4_ = uStack_90;
          begin._base._4_4_ = local_e8;
          begin._end = puVar3;
          local_a0 = puVar30;
          puStack_88 = puVar3;
          bVar17 = AddOn(&local_188,begin,5);
          if (!bVar17) {
            iStack_b8 = iVar37;
            uStack_b4 = (undefined4)local_f0;
            uStack_b0 = (undefined4)((ulong)local_f0 >> 0x20);
            uStack_ac = local_e8;
            begin_00._12_4_ = uStack_b4;
            begin_00._size = iVar37;
            begin_00._data = puVar30;
            begin_00._base._0_4_ = uStack_b0;
            begin_00._base._4_4_ = local_e8;
            begin_00._end = puVar3;
            local_c0 = puVar30;
            puStack_a8 = puVar3;
            bVar17 = AddOn(&local_188,begin_00,2);
            if (!bVar17) goto LAB_00165651;
          }
          std::operator+(&local_e0," ",&local_188.txt);
          std::__cxx11::string::_M_append
                    ((char *)&local_140,
                     CONCAT44(local_e0._M_dataplus._M_p._4_4_,(int)local_e0._M_dataplus._M_p));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(int)local_e0._M_dataplus._M_p) !=
              &local_e0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_e0._M_dataplus._M_p._4_4_,(int)local_e0._M_dataplus._M_p)
                            ,local_e0.field_2._M_allocated_capacity + 1);
          }
          next->_base = local_188.end._base;
          next->_end = local_188.end._end;
          *(undefined4 *)&next->_data = local_188.end._data._0_4_;
          *(undefined4 *)((long)&next->_data + 4) = local_188.end._data._4_4_;
          next->_size = CONCAT13(local_188.end._size._3_1_,
                                 CONCAT12(local_188.end._size._2_1_,(undefined2)local_188.end._size)
                                );
          *(undefined4 *)&next->field_0xc = local_188.end._12_4_;
          bVar35 = 0x33;
          if (local_140.format == EAN8) {
            bVar35 = bVar34;
          }
        }
      }
    }
LAB_00165651:
    format = local_140.format;
    if ((((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x6000) ==
         (undefined1  [12])0x4000) && (local_188.format == None)) {
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
    }
    else {
      if (puVar31 == puVar22) {
        local_1d0 = 0;
      }
      else {
        uVar20 = 0;
        do {
          uVar20 = uVar20 + *puVar31;
          puVar31 = puVar31 + 1;
        } while (puVar31 != puVar22);
        local_1d0 = (uint)uVar20;
      }
      puVar22 = next->_base;
      if (puVar22 == next->_data + next->_size) {
        iVar37 = -1;
      }
      else {
        uVar20 = 0;
        do {
          uVar20 = uVar20 + *puVar22;
          puVar22 = puVar22 + 1;
        } while (puVar22 != next->_data + next->_size);
        iVar37 = uVar20 - 1;
      }
      paVar1 = &local_80._msg.field_2;
      local_80._msg._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_1b8._data,local_1b8._8_8_ + (long)local_1b8._data);
      local_80._file._0_7_ = local_198;
      local_80._40_3_ = SUB43(CONCAT13(uStack_18e,CONCAT21(uStack_190,uStack_191)) >> 8,0);
      local_80._file._7_1_ = uStack_191;
      Result::Result(__return_storage_ptr__,&local_140.txt,local_e4,local_1d0,iVar37,format,
                     (SymbologyIdentifier)((uint)bVar35 << 8 | 0x45),&local_80,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._msg._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._msg._M_dataplus._M_p,
                        local_80._msg.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.txt._M_dataplus._M_p != &local_188.txt.field_2) {
      operator_delete(local_188.txt._M_dataplus._M_p,
                      CONCAT44(local_188.txt.field_2._M_allocated_capacity._4_4_,
                               local_188.txt.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  if ((Iterator *)local_1b8._data != &local_1b8._base) {
    operator_delete(local_1b8._data,(long)local_1b8._base + 1);
  }
LAB_001650c1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.txt._M_dataplus._M_p != &local_140.txt.field_2) {
    operator_delete(local_140.txt._M_dataplus._M_p,local_140.txt.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode MultiUPCEANReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>&) const
{
	const int minSize = 3 + 6*4 + 6; // UPC-E

	next = FindLeftGuard(next, minSize, END_PATTERN, QUIET_ZONE_LEFT);
	if (!next.isValid())
		return {};

	PartialResult res;
	auto begin = next;
	
	if (!(((_opts.hasFormat(BarcodeFormat::EAN13 | BarcodeFormat::UPCA)) && EAN13(res, begin)) ||
		  (_opts.hasFormat(BarcodeFormat::EAN8) && EAN8(res, begin)) ||
		  (_opts.hasFormat(BarcodeFormat::UPCE) && UPCE(res, begin))))
		return {};

	Error error;
	if (!GTIN::IsCheckDigitValid(res.format == BarcodeFormat::UPCE ? UPCEANCommon::ConvertUPCEtoUPCA(res.txt) : res.txt))
		error = ChecksumError();

	// If UPC-A was a requested format and we detected a EAN-13 code with a leading '0', then we drop the '0' and call it
	// a UPC-A code.
	// TODO: this is questionable
	if (_opts.hasFormat(BarcodeFormat::UPCA) && res.format == BarcodeFormat::EAN13 && res.txt.front() == '0') {
		res.txt = res.txt.substr(1);
		res.format = BarcodeFormat::UPCA;
	}

	// if we explicitly requested UPCA but not EAN13, don't return an EAN13 symbol
	if (res.format == BarcodeFormat::EAN13 && ! _opts.hasFormat(BarcodeFormat::EAN13))
		return {};

	// Symbology identifier modifiers ISO/IEC 15420:2009 Annex B Table B.1
	// ISO/IEC 15420:2009 (& GS1 General Specifications 5.1.3) states that the content for "]E0" should be 13 digits,
	// i.e. converted to EAN-13 if UPC-A/E, but not doing this here to maintain backward compatibility
	SymbologyIdentifier symbologyIdentifier = {'E', res.format == BarcodeFormat::EAN8 ? '4' : '0'};

	next = res.end;

	auto ext = res.end;
	PartialResult addOnRes;
	if (_opts.eanAddOnSymbol() != EanAddOnSymbol::Ignore && ext.skipSymbol() && ext.skipSingle(static_cast<int>(begin.sum() * 3.5))
		&& (AddOn(addOnRes, ext, 5) || AddOn(addOnRes, ext, 2))) {
		// ISO/IEC 15420:2009 states that the content for "]E3" should be 15 or 18 digits, i.e. converted to EAN-13
		// and extended with no separator, and that the content for "]E4" should be 8 digits, i.e. no add-on
		res.txt += " " + addOnRes.txt;
		next = addOnRes.end;

		if (res.format != BarcodeFormat::EAN8) // Keeping EAN-8 with add-on as "]E4"
			symbologyIdentifier.modifier = '3'; // Combined packet, EAN-13, UPC-A, UPC-E, with add-on
	}
	
	if (_opts.eanAddOnSymbol() == EanAddOnSymbol::Require && !addOnRes.isValid())
		return {};

	return Barcode(res.txt, rowNumber, begin.pixelsInFront(), next.pixelsTillEnd(), res.format, symbologyIdentifier, error);
}